

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCBoolean.cpp
# Opt level: O3

void Assimp::IFC::FilterPolygon
               (vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *resultpoly)

{
  undefined1 auVar1 [16];
  aiVector3t<double> *paVar2;
  ulong uVar3;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  _Var4;
  iterator __beg;
  long lVar5;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  _Var6;
  double dVar7;
  _Iter_comp_iter<Assimp::IFC::FuzzyVectorCompare> __binary_pred;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  
  _Var6._M_current =
       (resultpoly->super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  _Var4._M_current =
       (resultpoly->super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  uVar3 = ((long)_Var4._M_current - (long)_Var6._M_current >> 3) * -0x5555555555555555;
  if (uVar3 < 3) {
    if (_Var4._M_current == _Var6._M_current) {
      return;
    }
  }
  else {
    uVar3 = uVar3 & 0xffffffff;
    if (uVar3 == 0) {
      dVar10 = -20000000000.0;
      dVar12 = -20000000000.0;
      dVar7 = -20000000000.0;
    }
    else {
      dVar8 = 10000000000.0;
      dVar7 = -10000000000.0;
      lVar5 = 0;
      auVar9 = _DAT_006eaf80;
      auVar11 = _DAT_006eaf70;
      do {
        dVar10 = *(double *)((long)&(_Var6._M_current)->z + lVar5);
        if (dVar10 <= dVar8) {
          dVar8 = dVar10;
        }
        auVar1 = *(undefined1 (*) [16])((long)&(_Var6._M_current)->x + lVar5);
        auVar9 = minpd(auVar9,auVar1);
        auVar11 = maxpd(auVar11,auVar1);
        if (dVar7 <= dVar10) {
          dVar7 = dVar10;
        }
        lVar5 = lVar5 + 0x18;
      } while (uVar3 * 0x18 != lVar5);
      dVar10 = auVar11._0_8_ - auVar9._0_8_;
      dVar12 = auVar11._8_8_ - auVar9._8_8_;
      dVar7 = dVar7 - dVar8;
    }
    __binary_pred._M_comp.epsilon =
         (FuzzyVectorCompare)((dVar7 * dVar7 + dVar10 * dVar10 + dVar12 * dVar12) / 1000000.0);
    _Var4 = std::
            __unique<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Assimp::IFC::FuzzyVectorCompare>>
                      (_Var6,_Var4,__binary_pred);
    paVar2 = (resultpoly->
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>)._M_impl.
             super__Vector_impl_data._M_start;
    _Var6._M_current =
         (resultpoly->super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (_Var4._M_current != _Var6._M_current) {
      (resultpoly->super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
      _M_impl.super__Vector_impl_data._M_finish = _Var4._M_current;
      _Var6 = _Var4;
    }
    if (paVar2 == _Var6._M_current) {
      return;
    }
    dVar10 = paVar2->x - _Var6._M_current[-1].x;
    dVar12 = paVar2->y - _Var6._M_current[-1].y;
    dVar7 = paVar2->z - _Var6._M_current[-1].z;
    if ((double)__binary_pred._M_comp.epsilon <=
        ABS(dVar7 * dVar7 + dVar10 * dVar10 + dVar12 * dVar12)) {
      return;
    }
    _Var6._M_current = _Var6._M_current + -1;
  }
  (resultpoly->super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>)._M_impl
  .super__Vector_impl_data._M_finish = _Var6._M_current;
  return;
}

Assistant:

void FilterPolygon(std::vector<IfcVector3>& resultpoly)
{
    if( resultpoly.size() < 3 )
    {
        resultpoly.clear();
        return;
    }

    IfcVector3 vmin, vmax;
    ArrayBounds(resultpoly.data(), static_cast<unsigned int>(resultpoly.size()), vmin, vmax);

    // filter our IfcFloat points - those may happen if a point lies
    // directly on the intersection line or directly on the clipping plane
    const IfcFloat epsilon = (vmax - vmin).SquareLength() / 1e6f;
    FuzzyVectorCompare fz(epsilon);
    std::vector<IfcVector3>::iterator e = std::unique(resultpoly.begin(), resultpoly.end(), fz);

    if( e != resultpoly.end() )
        resultpoly.erase(e, resultpoly.end());

    if( !resultpoly.empty() && fz(resultpoly.front(), resultpoly.back()) )
        resultpoly.pop_back();
}